

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O3

int ffgcls2(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp
           ,char *nulval,char **array,char *nularray,int *anynul,int *status)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  long ngroups;
  long lVar11;
  char *pcVar12;
  bool bVar13;
  long lVar14;
  int maxelem;
  long twidth;
  size_t local_71d0;
  LONGLONG elemnum;
  LONGLONG repeat;
  int tcode;
  long incre;
  int hdutype;
  long local_71a0;
  long local_7198;
  long local_7190;
  LONGLONG rowlen;
  LONGLONG startpos;
  char snull [20];
  double zero;
  double scale;
  LONGLONG tnull;
  char tform [20];
  char message [81];
  char local_70b9;
  double cbuff [3600];
  
  if (nelem == 0 || 0 < *status) {
    return *status;
  }
  local_71d0 = firstrow;
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  if (nultyp == 2) {
    memset(nularray,0,nelem);
  }
  if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
    snprintf(message,0x51,"Specified column number is out of range: %d",(ulong)(uint)colnum);
    ffpmsg(message);
    *status = 0x12e;
    return 0x12e;
  }
  tcode = fptr->Fptr->tableptr[(ulong)(uint)colnum - 1].tdatatype;
  if (tcode == 0x10) {
    iVar5 = ffgcprll(fptr,colnum,local_71d0,firstelem,nelem,0,&scale,&zero,tform,&twidth,&tcode,
                     &maxelem,&startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,status
                    );
    if (iVar5 < 1) {
      if (0xb40 < twidth) {
        maxelem = 1;
        incre = twidth;
        repeat = 1;
      }
      goto LAB_001a0ca0;
    }
  }
  else {
    if (tcode != -0x10) {
      *status = 0x135;
      return 0x135;
    }
    iVar5 = ffgcprll(fptr,colnum,local_71d0,1,1,0,&scale,&zero,tform,&twidth,&tcode,&maxelem,
                     &startpos,&elemnum,&incre,&repeat,&rowlen,&hdutype,&tnull,snull,status);
    if (iVar5 < 1) {
      twidth = repeat;
      nelem = 1;
LAB_001a0ca0:
      lVar14 = twidth;
      local_71d0 = strlen(snull);
      local_71d0 = local_71d0 + (local_71d0 == 0);
      bVar13 = true;
      if ((nultyp != 1 || nulval != (char *)0x0) &&
         (((nulval == (char *)0x0 || nultyp != 1 || (*nulval != '\0')) && (snull[0] != '\x01')))) {
        bVar13 = nultyp == 0 || lVar14 < (long)local_71d0;
      }
      local_71a0 = 0;
      lVar14 = 0;
      do {
        lVar11 = (long)maxelem;
        if (nelem < maxelem) {
          lVar11 = nelem;
        }
        ngroups = repeat - elemnum;
        if (lVar11 < repeat - elemnum) {
          ngroups = lVar11;
        }
        local_7190 = nelem;
        ffmbyt(fptr,elemnum * incre + rowlen * local_71a0 + startpos,0,status);
        if (incre - twidth == 0) {
          ffgbyt(fptr,incre * ngroups,cbuff,status);
        }
        else {
          ffgbytoff(fptr,twidth,ngroups,incre - twidth,cbuff,status);
        }
        lVar11 = ngroups + lVar14;
        local_7198 = lVar11;
        if (0 < ngroups) {
          pcVar12 = (char *)((long)cbuff + twidth * ngroups + -1);
          do {
            pcVar3 = array[lVar11 + -1];
            pcVar9 = pcVar3 + twidth;
            pcVar8 = pcVar3 + twidth + -1;
            if (twidth < 2) {
              *pcVar9 = '\0';
              if (twidth == 1) {
                uVar7 = 0;
                goto LAB_001a0e4c;
              }
            }
            else {
              if (*pcVar12 == ' ') {
                pcVar9 = pcVar3 + 1;
                lVar4 = twidth;
                pcVar8 = pcVar12;
                do {
                  lVar6 = lVar4;
                  if (lVar6 < 3) {
                    uVar7 = 0;
                    pcVar8 = pcVar3;
                    pcVar12 = pcVar12 + (1 - twidth);
                    goto LAB_001a0e49;
                  }
                  pcVar1 = pcVar8 + -1;
                  pcVar2 = pcVar8 + -1;
                  lVar4 = lVar6 + -1;
                  pcVar8 = pcVar1;
                } while (*pcVar2 == ' ');
                pcVar9 = pcVar3 + lVar6 + -1;
                uVar7 = lVar6 - 2;
                pcVar8 = pcVar3 + lVar6 + -2;
                pcVar12 = pcVar1;
              }
              else {
                uVar7 = twidth - 1;
              }
LAB_001a0e49:
              *pcVar9 = '\0';
LAB_001a0e4c:
              uVar10 = 0;
              do {
                pcVar8[uVar10] = pcVar12[uVar10];
                uVar10 = uVar10 - 1;
              } while (~uVar7 != uVar10);
              pcVar12 = pcVar12 + uVar10;
            }
            lVar11 = lVar11 + -1;
            if (!bVar13) {
              pcVar9 = array[lVar11];
              iVar5 = strncmp(snull,pcVar9,local_71d0);
              if (iVar5 == 0) {
                *anynul = 1;
                if (nultyp == 1) {
                  if (nulval == (char *)0x0) {
                    pcVar9[0] = ' ';
                    pcVar9[1] = '\0';
                  }
                  else {
                    strcpy(pcVar9,nulval);
                  }
                }
                else {
                  nularray[lVar11] = '\x01';
                }
              }
            }
          } while (lVar14 < lVar11);
        }
        if (0 < *status) {
          snprintf(message,0x51,"Error reading elements %.0f thru %.0f of data array (ffpcls).",
                   (double)lVar14 + 1.0,(double)ngroups + (double)lVar14);
          ffpmsg(message);
          break;
        }
        nelem = local_7190 - ngroups;
        if (nelem == 0) {
          return *status;
        }
        elemnum = ngroups + elemnum;
        lVar14 = local_7198;
        if (elemnum == repeat) {
          elemnum = 0;
          local_71a0 = local_71a0 + 1;
        }
      } while( true );
    }
  }
  return *status;
}

Assistant:

int ffgcls2 ( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st) */
            LONGLONG  nelem,      /* I - number of strings to read              */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char  *nulval,    /* I - value for null pixels if nultyp = 1     */
            char **array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of string values from a column in the current FITS HDU.
*/
{
    double dtemp;
    long nullen; 
    int tcode, maxelem, hdutype, nulcheck;
    long twidth, incre;
    long ii, jj, ntodo;
    LONGLONG repeat, startpos, elemnum, readptr, tnull, rowlen, rownum, remain, next;
    double scale, zero;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value  */
    tcolumn *colptr;

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    char *buffer, *arrayptr;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = colptr->tdatatype;

    if (tcode == -TSTRING) /* variable length column in a binary table? */
    {
      /* only read a single string; ignore value of firstelem */

      if (ffgcprll( fptr, colnum, firstrow, 1, 1, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      remain = 1;
      twidth = (long) repeat;  
    }
    else if (tcode == TSTRING)
    {
      if (ffgcprll( fptr, colnum, firstrow, firstelem, nelem, 0, &scale, &zero,
        tform, &twidth, &tcode, &maxelem, &startpos,  &elemnum, &incre,
        &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0)
        return(*status);

      /* if string length is greater than a FITS block (2880 char) then must */
      /* only read 1 string at a time, to force reading by ffgbyt instead of */
      /* ffgbytoff (ffgbytoff can't handle this case) */
      if (twidth > IOBUFLEN) {
        maxelem = 1;
        incre = twidth;
        repeat = 1;
      }   

      remain = nelem;
    }
    else
        return(*status = NOT_ASCII_COL);

    nullen = strlen(snull);   /* length of the undefined pixel string */
    if (nullen == 0)
        nullen = 1;
 
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (nultyp == 1 && nulval && nulval[0] == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (snull[0] == ASCII_NULL_UNDEFINED)
       nulcheck = 0;   /* null value string in ASCII table not defined */

    else if (nullen > twidth)
       nulcheck = 0;   /* null value string is longer than width of column  */
                       /* thus impossible for any column elements to = null */

    /*---------------------------------------------------------------------*/
    /*  Now read the strings one at a time from the FITS column.           */
    /*---------------------------------------------------------------------*/
    next = 0;                 /* next element in array to be read  */
    rownum = 0;               /* row number, relative to firstrow     */

    while (remain)
    {
      /* limit the number of pixels to process at one time to the number that
         will fit in the buffer space or to the number of pixels that remain
         in the current vector, which ever is smaller.
      */
      ntodo = (long) minvalue(remain, maxelem);      
      ntodo = (long) minvalue(ntodo, (repeat - elemnum));

      readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * incre);
      ffmbyt(fptr, readptr, REPORT_EOF, status);  /* move to read position */

      /* read the array of strings from the FITS file into the buffer */

      if (incre == twidth)
         ffgbyt(fptr, ntodo * twidth, cbuff, status);
      else
         ffgbytoff(fptr, twidth, ntodo, incre - twidth, cbuff, status);

      /* copy from the buffer into the user's array of strings */
      /* work backwards from last char of last string to 1st char of 1st */

      buffer = ((char *) cbuff) + (ntodo * twidth) - 1;

      for (ii = (long) (next + ntodo - 1); ii >= next; ii--)
      {
         arrayptr = array[ii] + twidth - 1;

         for (jj = twidth - 1; jj > 0; jj--)  /* ignore trailing blanks */
         {
            if (*buffer == ' ')
            {
              buffer--;
              arrayptr--;
            }
            else
              break;
         }
         *(arrayptr + 1) = 0;  /* write the string terminator */
         
         for (; jj >= 0; jj--)    /* copy the string itself */
         {
           *arrayptr = *buffer;
           buffer--;
           arrayptr--;
         }

         /* check if null value is defined, and if the   */
         /* column string is identical to the null string */
         if (nulcheck && !strncmp(snull, array[ii], nullen) )
         {
           *anynul = 1;   /* this is a null value */
           if (nultyp == 1) {
	   
	     if (nulval)
                strcpy(array[ii], nulval);
	     else
	        strcpy(array[ii], " ");
	     
           } else
             nularray[ii] = 1;
         }
      }
    
      if (*status > 0)  /* test for error during previous read operation */
      {
         dtemp = (double) next;
         snprintf(message,FLEN_ERRMSG,
          "Error reading elements %.0f thru %.0f of data array (ffpcls).",
             dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
      }

      /*--------------------------------------------*/
      /*  increment the counters for the next loop  */
      /*--------------------------------------------*/
      next += ntodo;
      remain -= ntodo;
      if (remain)
      {
          elemnum += ntodo;
          if (elemnum == repeat)  /* completed a row; start on next row */
          {
              elemnum = 0;
              rownum++;
          }
      }
    }  /*  End of main while Loop  */

    return(*status);
}